

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void wiz_hack_map(chunk *c,player *p,_func_void_chunk_ptr_void_ptr_loc__Bool_ptr_uint8_t_ptr *func,
                 void *closure)

{
  _Bool _Var1;
  uint8_t local_3a;
  _Bool local_39;
  uint8_t color;
  loc_conflict lStack_38;
  _Bool show;
  loc_conflict grid;
  wchar_t x;
  wchar_t y;
  void *closure_local;
  _func_void_chunk_ptr_void_ptr_loc__Bool_ptr_uint8_t_ptr *func_local;
  player *p_local;
  chunk *c_local;
  
  for (grid.y = Term->offset_y;
      grid.y < Term->offset_y +
               ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode])
               / (int)(uint)tile_height; grid.y = grid.y + L'\x01') {
    for (grid.x = Term->offset_x;
        grid.x < Term->offset_x +
                 ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
        grid.x = grid.x + L'\x01') {
      lStack_38 = (loc_conflict)loc(grid.x,grid.y);
      _Var1 = square_in_bounds_fully(c,lStack_38);
      if ((_Var1) && ((*func)(c,closure,lStack_38,&local_39,&local_3a), (local_39 & 1U) != 0)) {
        _Var1 = loc_eq((loc)lStack_38,p->grid);
        if (_Var1) {
          print_rel(L'@',local_3a,grid.y,grid.x);
        }
        else {
          _Var1 = square_ispassable(c,lStack_38);
          if (_Var1) {
            print_rel(L'*',local_3a,grid.y,grid.x);
          }
          else {
            print_rel(L'#',local_3a,grid.y,grid.x);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void wiz_hack_map(struct chunk *c, struct player *p,
	void (*func)(struct chunk *, void *, struct loc, bool *, uint8_t *),
	void *closure)
{
	int y;

	for (y = Term->offset_y; y < Term->offset_y + SCREEN_HGT; y++) {
		int x;

		for (x = Term->offset_x; x < Term->offset_x + SCREEN_WID; x++) {
			struct loc grid = loc(x, y);
			bool show;
			uint8_t color;

			if (!square_in_bounds_fully(c, grid)) continue;

			(*func)(c, closure, grid, &show, &color);
			if (!show) continue;

			if (loc_eq(grid, p->grid)) {
				print_rel(L'@', color, y, x);
			} else if (square_ispassable(c, grid)) {
				print_rel(L'*', color, y, x);
			} else {
				print_rel(L'#', color, y, x);
			}
		}
	}
}